

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

Message * __thiscall
cpprofiler::MessageMarshalling::makeNode
          (MessageMarshalling *this,NodeUID node,NodeUID parent,int32_t alt,int32_t kids,
          NodeStatus status)

{
  Message *in_RDI;
  int32_t in_R9D;
  int32_t in_stack_00000008;
  NodeStatus in_stack_00000010;
  NodeUID local_28 [2];
  NodeUID local_c;
  
  Message::reset(in_RDI);
  Message::set_type(in_RDI,NODE);
  Message::set_nodeUID(in_RDI,&local_c);
  Message::set_parentUID(in_RDI,local_28);
  Message::set_alt(in_RDI,in_R9D);
  Message::set_kids(in_RDI,in_stack_00000008);
  Message::set_status(in_RDI,in_stack_00000010);
  return in_RDI;
}

Assistant:

Message& makeNode(NodeUID node, NodeUID parent,
                    int32_t alt, int32_t kids, NodeStatus status) {
    msg.reset();
    msg.set_type(MsgType::NODE);

    msg.set_nodeUID(node);
    msg.set_parentUID(parent);

    msg.set_alt(alt);
    msg.set_kids(kids);
    msg.set_status(status);

    return msg;
  }